

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

matrix * __thiscall matrix::operator=(matrix *this,matrix *v)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  int local_20;
  int local_1c;
  int j;
  int i;
  matrix *v_local;
  matrix *this_local;
  
  iVar2 = get_nl(v);
  this->nl_ = iVar2;
  iVar2 = get_nc(v);
  this->nc_ = iVar2;
  local_1c = 0;
  while( true ) {
    iVar2 = get_nl(v);
    if (iVar2 <= local_1c) break;
    local_20 = 0;
    while( true ) {
      iVar2 = get_nl(v);
      if (iVar2 <= local_20) break;
      dVar3 = operator()(v,local_1c,local_20);
      pdVar1 = this->data_;
      iVar2 = get_nl(this);
      pdVar1[local_1c * iVar2 + local_20] = dVar3;
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  return this;
}

Assistant:

matrix& matrix::operator= (const matrix& v){
    nl_ = v.get_nl();
    nc_ = v.get_nc();
    for(int i = 0; i < v.get_nl(); i++){
        for(int j = 0; j < v.get_nl(); j++){
            data_[i*get_nl()+j] = v(i, j);
        }
    }
    return *this;
}